

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O1

lys_module *
ly_resolve_prefix(ly_ctx *ctx,void *prefix,size_t prefix_len,LY_VALUE_FORMAT format,
                 void *prefix_data)

{
  lys_module *plVar1;
  char *pcVar2;
  
  if (prefix == (void *)0x0) {
    pcVar2 = "prefix";
  }
  else {
    if (prefix_len != 0) {
      switch(format) {
      case LY_VALUE_CANON:
      case LY_VALUE_JSON:
      case LY_VALUE_LYB:
        plVar1 = ly_ctx_get_module_implemented2(ctx,(char *)prefix,prefix_len);
        return plVar1;
      case LY_VALUE_SCHEMA:
        plVar1 = ly_schema_resolve_prefix
                           ((ly_ctx *)prefix,(char *)prefix_len,(size_t)prefix_data,
                            &switchD_0019e834::switchdataD_001dd3d8);
        return plVar1;
      case LY_VALUE_SCHEMA_RESOLVED:
        plVar1 = ly_schema_resolved_resolve_prefix
                           ((ly_ctx *)prefix,(char *)prefix_len,(size_t)prefix_data,
                            &switchD_0019e834::switchdataD_001dd3d8);
        return plVar1;
      case LY_VALUE_XML:
      case LY_VALUE_STR_NS:
        plVar1 = ly_xml_resolve_prefix(ctx,(char *)prefix,prefix_len,prefix_data);
        return plVar1;
      default:
        return (lys_module *)0x0;
      }
    }
    pcVar2 = "prefix_len";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_resolve_prefix");
  return (lys_module *)0x0;
}

Assistant:

const struct lys_module *
ly_resolve_prefix(const struct ly_ctx *ctx, const void *prefix, size_t prefix_len, LY_VALUE_FORMAT format,
        const void *prefix_data)
{
    const struct lys_module *mod = NULL;

    LY_CHECK_ARG_RET(ctx, prefix, prefix_len, NULL);

    switch (format) {
    case LY_VALUE_SCHEMA:
        mod = ly_schema_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        mod = ly_schema_resolved_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        mod = ly_xml_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        mod = ly_json_resolve_prefix(ctx, prefix, prefix_len, prefix_data);
        break;
    }

    return mod;
}